

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O0

int compress2mem_from_mem
              (char *inmemptr,size_t inmemsize,char **buffptr,size_t *buffsize,
              _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  int iVar1;
  char *pcVar2;
  char *local_b8;
  z_stream c_stream;
  int err;
  size_t *filesize_local;
  _func_void_ptr_void_ptr_size_t *mem_realloc_local;
  size_t *buffsize_local;
  char **buffptr_local;
  size_t inmemsize_local;
  char *inmemptr_local;
  
  if (*status < 1) {
    c_stream.state = (internal_state *)0x0;
    c_stream.zalloc = (alloc_func)0x0;
    c_stream.zfree = (free_func)0x0;
    iVar1 = deflateInit2_(&local_b8,1,8,0x1f,8,0,"1.2.11",0x70);
    if (iVar1 == 0) {
      c_stream.next_in._0_4_ = (undefined4)inmemsize;
      c_stream.total_in = (uLong)*buffptr;
      c_stream.next_out._0_4_ = (undefined4)*buffsize;
      c_stream.reserved._4_4_ = 0;
      local_b8 = inmemptr;
      while (c_stream.reserved._4_4_ = deflate(&local_b8,4), c_stream.reserved._4_4_ != 1) {
        if (c_stream.reserved._4_4_ != 0) {
          deflateEnd(&local_b8);
          *status = 0x19d;
          return 0x19d;
        }
        if (mem_realloc == (_func_void_ptr_void_ptr_size_t *)0x0) {
          deflateEnd(&local_b8);
          *status = 0x19d;
          return 0x19d;
        }
        pcVar2 = (char *)(*mem_realloc)(*buffptr,*buffsize + 0x7080);
        *buffptr = pcVar2;
        if (*buffptr == (char *)0x0) {
          deflateEnd(&local_b8);
          *status = 0x19d;
          return 0x19d;
        }
        c_stream.next_out._0_4_ = 0x7080;
        c_stream.total_in = (uLong)(*buffptr + *buffsize);
        *buffsize = *buffsize + 0x7080;
      }
      if (filesize != (size_t *)0x0) {
        *filesize = c_stream._32_8_;
      }
      iVar1 = deflateEnd(&local_b8);
      if (iVar1 == 0) {
        inmemptr_local._4_4_ = *status;
      }
      else {
        *status = 0x19d;
        inmemptr_local._4_4_ = 0x19d;
      }
    }
    else {
      *status = 0x19d;
      inmemptr_local._4_4_ = 0x19d;
    }
  }
  else {
    inmemptr_local._4_4_ = *status;
  }
  return inmemptr_local._4_4_;
}

Assistant:

int compress2mem_from_mem(                                                
             char *inmemptr,     /* I - memory pointer to uncompressed bytes */
             size_t inmemsize,   /* I - size of input uncompressed file      */
             char **buffptr,   /* IO - memory pointer for compressed file    */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Compress the file into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    int err;
    z_stream c_stream;  /* compression stream */

    if (*status > 0)
        return(*status);

    c_stream.zalloc = (alloc_func)0;
    c_stream.zfree = (free_func)0;
    c_stream.opaque = (voidpf)0;

    /* Initialize the compression.  The argument (15+16) tells the 
       compressor that we are to use the gzip algorythm.
       Also use Z_BEST_SPEED for maximum speed with very minor loss
       in compression factor. */
    err = deflateInit2(&c_stream, Z_BEST_SPEED, Z_DEFLATED,
                       (15+16), 8, Z_DEFAULT_STRATEGY);

    if (err != Z_OK) return(*status = 413);

    c_stream.next_in = (unsigned char*)inmemptr;
    c_stream.avail_in = inmemsize;

    c_stream.next_out = (unsigned char*) *buffptr;
    c_stream.avail_out = *buffsize;

    for (;;) {
        /* compress as much of the input as will fit in the output */
        err = deflate(&c_stream, Z_FINISH);

        if (err == Z_STREAM_END) {  /* We reached the end of the input */
	   break;
        } else if (err == Z_OK ) { /* need more space in output buffer */

            if (mem_realloc) {   
                *buffptr = mem_realloc(*buffptr,*buffsize + BUFFINCR);
                if (*buffptr == NULL){
                    deflateEnd(&c_stream);
                    return(*status = 413);  /* memory allocation failed */
                }

                c_stream.avail_out = BUFFINCR;
                c_stream.next_out = (unsigned char*) (*buffptr + *buffsize);
                *buffsize = *buffsize + BUFFINCR;

            } else  { /* error: no realloc function available */
                deflateEnd(&c_stream);
                return(*status = 413);
            }
        } else {  /* some other error */
            deflateEnd(&c_stream);
            return(*status = 413);
        }
    }

    /* Set the output file size to be the total output data */
    if (filesize) *filesize = c_stream.total_out;

    /* End the compression */
    err = deflateEnd(&c_stream);

    if (err != Z_OK) return(*status = 413);
     
    return(*status);
}